

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O3

void __thiscall game::game(game *this)

{
  (this->boards).BQ = 0;
  (this->boards).BK = 0;
  (this->boards).BB = 0;
  (this->boards).BR = 0;
  (this->boards).BP = 0;
  (this->boards).BN = 0;
  (this->boards).WQ = 0;
  (this->boards).WK = 0;
  (this->boards).WB = 0;
  (this->boards).WR = 0;
  (this->boards).WP = 0;
  (this->boards).WN = 0;
  (this->boards).castleInfo.whiteACan = true;
  (this->boards).castleInfo.whiteHCan = true;
  (this->boards).castleInfo.blackACan = true;
  (this->boards).castleInfo.blackHCan = true;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<bitboards,_std::allocator<bitboards>_>::_M_initialize_map
            ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&this->boardHistory,0);
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->history).c.super__Deque_base<move,_std::allocator<move>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<move,_std::allocator<move>_>::_M_initialize_map
            ((_Deque_base<move,_std::allocator<move>_> *)&this->history,0);
  this->blacksTurn = false;
  bitboards::initStandardBoard(&this->boards);
  return;
}

Assistant:

game() {
    boards.initStandardBoard();
  }